

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_arithmetic.c
# Opt level: O0

void binop1_pow_bang(t_binop *x)

{
  float fVar1;
  t_float local_18;
  t_float r;
  t_binop *x_local;
  
  if ((((x->x_f1 == 0.0) && (!NAN(x->x_f1))) && (x->x_f2 <= 0.0 && x->x_f2 != 0.0)) ||
     ((x->x_f1 <= 0.0 && x->x_f1 != 0.0 &&
      ((fVar1 = x->x_f2 - (float)(int)x->x_f2, fVar1 != 0.0 || (NAN(fVar1))))))) {
    local_18 = 0.0;
  }
  else {
    local_18 = powf(x->x_f1,x->x_f2);
  }
  outlet_float((x->x_obj).te_outlet,local_18);
  return;
}

Assistant:

static void binop1_pow_bang(t_binop *x)
{
    t_float r = (x->x_f1 == 0 && x->x_f2 < 0) ||
        (x->x_f1 < 0 && (x->x_f2 - (int)x->x_f2) != 0) ?
            0 : POW(x->x_f1, x->x_f2);
    outlet_float(x->x_obj.ob_outlet, r);
}